

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

SoundAnalysisPreprocessing * __thiscall
CoreML::Specification::Model::mutable_soundanalysispreprocessing(Model *this)

{
  SoundAnalysisPreprocessing *this_00;
  
  if (this->_oneof_case_[0] == 0x7d3) {
    this_00 = (SoundAnalysisPreprocessing *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x7d3;
    this_00 = (SoundAnalysisPreprocessing *)operator_new(0x20);
    CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(this_00);
    (this->Type_).soundanalysispreprocessing_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing* Model::mutable_soundanalysispreprocessing() {
  if (!has_soundanalysispreprocessing()) {
    clear_Type();
    set_has_soundanalysispreprocessing();
    Type_.soundanalysispreprocessing_ = new ::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.soundAnalysisPreprocessing)
  return Type_.soundanalysispreprocessing_;
}